

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlipTiles.cpp
# Opt level: O0

void __thiscall commands::FlipTiles::execute(FlipTiles *this)

{
  size_type sVar1;
  long in_RDI;
  Tile tile;
  size_t i;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Command *in_stack_ffffffffffffffc0;
  Board *this_00;
  undefined8 local_10;
  
  Command::execute(in_stack_ffffffffffffffc0);
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>::size
                      ((vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_> *)
                       (in_RDI + 0x18));
    if (sVar1 <= local_10) break;
    this_00 = *(Board **)(in_RDI + 0x10);
    std::vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>::operator[]
              ((vector<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_> *)(in_RDI + 0x18),
               local_10);
    Board::accessTile(this_00,(Vector2i *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    Tile::flip((Tile *)this_00,(bool)in_stack_ffffffffffffffbf);
    if ((*(byte *)(in_RDI + 0x31) & 1) != 0) {
      Tile::setHighlight((Tile *)this_00,(bool)in_stack_ffffffffffffffbf);
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void FlipTiles::execute() {
    Command::execute();
    for (size_t i = 0; i < tilePositions_.size(); ++i) {
        auto tile = board_.accessTile(tilePositions_[i]);
        tile.flip(acrossVertical_);
        if (highlightTiles_) {
            tile.setHighlight(true);
        }
    }
}